

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::RepeatedString::GenerateInlineAccessorDefinitions
          (RepeatedString *this,Printer *p)

{
  char *pcVar1;
  long lVar2;
  undefined8 uVar3;
  bool bytes;
  allocator<char> local_2a1;
  Printer *p_local;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  _Any_data local_278;
  code *local_268;
  code *pcStack_260;
  Sub local_258;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  variant<std::__cxx11::string,std::function<bool()>> local_180 [32];
  char local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  Sub local_e8;
  
  bytes = ((this->super_FieldGeneratorBase).field_)->type_ == '\f';
  p_local = p;
  GetEmitRepeatedFieldGetterSub(&local_258,this->opts_,p);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"bytes_tag",&local_2a1);
  local_1a0 = local_190;
  if (local_298 == local_288) {
    uStack_188 = uStack_280;
  }
  else {
    local_1a0 = local_298;
  }
  local_198 = local_290;
  local_290 = 0;
  local_288[0] = 0;
  local_268 = (code *)0x0;
  pcStack_260 = (code *)0x0;
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  local_298 = local_288;
  local_278._M_unused._M_object = operator_new(0x18);
  *(bool **)local_278._M_unused._0_8_ = &bytes;
  *(Printer ***)((long)local_278._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_278._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_260 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_268 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_180,(function<bool_()> *)&local_278);
  std::_Function_base::~_Function_base((_Function_base *)&local_278);
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  if (local_160 == '\x01') {
    std::__cxx11::string::assign((char *)&local_158);
  }
  local_f0 = 0;
  GetEmitRepeatedFieldMutableSub(&local_e8,this->opts_,p_local,false);
  io::Printer::Emit(p,&local_258,3,0x9f7,
                    "\n        inline ::std::string* $nonnull$ $Msg$::add_$name$()\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          ::std::string* _s = _internal_mutable_$name_internal$()->Add();\n          $annotate_add_mutable$;\n          // @@protoc_insertion_point(field_add_mutable:$pkg.Msg.field$)\n          return _s;\n        }\n        inline const ::std::string& $Msg$::$name$(int index) const\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_get$;\n          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)\n          return $getter$;\n        }\n        inline ::std::string* $nonnull$ $Msg$::mutable_$name$(int index)\n            ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_mutable$;\n          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)\n          return $mutable$;\n        }\n        template <typename Arg_, typename... Args_>\n        inline void $Msg$::set_$name$(int index, Arg_&& value, Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $pbi$::AssignToString(*$mutable$, ::std::forward<Arg_>(value),\n                                args... $bytes_tag$);\n          $annotate_set$;\n          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)\n        }\n        template <typename Arg_, typename... Args_>\n        inline void $Msg$::add_$name$(Arg_&& value, Args_... args) {\n          $WeakDescriptorSelfPin$;\n          $TsanDetectConcurrentMutation$;\n          $pbi$::AddToRepeatedPtrField(*_internal_mutable_$name_internal$(),\n                                       ::std::forward<Arg_>(value),\n                                       args... $bytes_tag$);\n          $annotate_add$;\n          // @@protoc_insertion_point(field_add:$pkg.Msg.field$)\n        }\n        inline const $pb$::RepeatedPtrField<::std::string>& $Msg$::$name$()\n            const ABSL_ATTRIBUTE_LIFETIME_BOUND {\n          $WeakDescriptorSelfPin$;\n          $annotate_list$;\n   ..." /* TRUNCATED STRING LITERAL */
                   );
  lVar2 = 0x170;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_258.key_._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != -0xb8);
  std::__cxx11::string::~string((string *)&local_298);
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    pcVar1 = 
    "\n      inline const $pb$::RepeatedPtrField<::std::string>&\n      $Msg$::_internal_$name_internal$() const {\n        $TsanDetectConcurrentRead$;\n        return *$field_$;\n      }\n      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$\n      $Msg$::_internal_mutable_$name_internal$() {\n        $TsanDetectConcurrentRead$;\n        $PrepareSplitMessageForWrite$;\n        if ($field_$.IsDefault()) {\n          $field_$.Set(\n              $pb$::Arena::Create<$pb$::RepeatedPtrField<::std::string>>(\n                  GetArena()));\n        }\n        return $field_$.Get();\n      }\n    "
    ;
    uVar3 = 0x249;
  }
  else {
    pcVar1 = 
    "\n      inline const $pb$::RepeatedPtrField<::std::string>&\n      $Msg$::_internal_$name_internal$() const {\n        $TsanDetectConcurrentRead$;\n        return $field_$;\n      }\n      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$\n      $Msg$::_internal_mutable_$name_internal$() {\n        $TsanDetectConcurrentRead$;\n        return &$field_$;\n      }\n    "
    ;
    uVar3 = 0x16c;
  }
  io::Printer::Emit(p_local,uVar3,pcVar1);
  return;
}

Assistant:

void RepeatedString::GenerateInlineAccessorDefinitions(io::Printer* p) const {
  bool bytes = field_->type() == FieldDescriptor::TYPE_BYTES;
  p->Emit(
      {
          GetEmitRepeatedFieldGetterSub(*opts_, p),
          {"bytes_tag",
           [&] {
             if (bytes) {
               p->Emit(", $pbi$::BytesTag{}");
             }
           }},
          GetEmitRepeatedFieldMutableSub(*opts_, p),
      },
      R"cc(
        inline ::std::string* $nonnull$ $Msg$::add_$name$()
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          ::std::string* _s = _internal_mutable_$name_internal$()->Add();
          $annotate_add_mutable$;
          // @@protoc_insertion_point(field_add_mutable:$pkg.Msg.field$)
          return _s;
        }
        inline const ::std::string& $Msg$::$name$(int index) const
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_get$;
          // @@protoc_insertion_point(field_get:$pkg.Msg.field$)
          return $getter$;
        }
        inline ::std::string* $nonnull$ $Msg$::mutable_$name$(int index)
            ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_mutable$;
          // @@protoc_insertion_point(field_mutable:$pkg.Msg.field$)
          return $mutable$;
        }
        template <typename Arg_, typename... Args_>
        inline void $Msg$::set_$name$(int index, Arg_&& value, Args_... args) {
          $WeakDescriptorSelfPin$;
          $pbi$::AssignToString(*$mutable$, ::std::forward<Arg_>(value),
                                args... $bytes_tag$);
          $annotate_set$;
          // @@protoc_insertion_point(field_set:$pkg.Msg.field$)
        }
        template <typename Arg_, typename... Args_>
        inline void $Msg$::add_$name$(Arg_&& value, Args_... args) {
          $WeakDescriptorSelfPin$;
          $TsanDetectConcurrentMutation$;
          $pbi$::AddToRepeatedPtrField(*_internal_mutable_$name_internal$(),
                                       ::std::forward<Arg_>(value),
                                       args... $bytes_tag$);
          $annotate_add$;
          // @@protoc_insertion_point(field_add:$pkg.Msg.field$)
        }
        inline const $pb$::RepeatedPtrField<::std::string>& $Msg$::$name$()
            const ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_list$;
          // @@protoc_insertion_point(field_list:$pkg.Msg.field$)
          return _internal_$name_internal$();
        }
        inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
        $Msg$::mutable_$name$() ABSL_ATTRIBUTE_LIFETIME_BOUND {
          $WeakDescriptorSelfPin$;
          $annotate_mutable_list$;
          // @@protoc_insertion_point(field_mutable_list:$pkg.Msg.field$)
          $TsanDetectConcurrentMutation$;
          return _internal_mutable_$name_internal$();
        }
      )cc");
  if (should_split()) {
    p->Emit(R"cc(
      inline const $pb$::RepeatedPtrField<::std::string>&
      $Msg$::_internal_$name_internal$() const {
        $TsanDetectConcurrentRead$;
        return *$field_$;
      }
      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
      $Msg$::_internal_mutable_$name_internal$() {
        $TsanDetectConcurrentRead$;
        $PrepareSplitMessageForWrite$;
        if ($field_$.IsDefault()) {
          $field_$.Set(
              $pb$::Arena::Create<$pb$::RepeatedPtrField<::std::string>>(
                  GetArena()));
        }
        return $field_$.Get();
      }
    )cc");
  } else {
    p->Emit(R"cc(
      inline const $pb$::RepeatedPtrField<::std::string>&
      $Msg$::_internal_$name_internal$() const {
        $TsanDetectConcurrentRead$;
        return $field_$;
      }
      inline $pb$::RepeatedPtrField<::std::string>* $nonnull$
      $Msg$::_internal_mutable_$name_internal$() {
        $TsanDetectConcurrentRead$;
        return &$field_$;
      }
    )cc");
  }
}